

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O2

void __thiscall JetHead::vector<Regex::GroupData>::clear(vector<Regex::GroupData> *this)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  lVar1 = 8;
  for (uVar2 = 0; uVar2 < this->mSize; uVar2 = uVar2 + 1) {
    std::__cxx11::string::~string((string *)((long)&this->mData->start_pos + lVar1));
    lVar1 = lVar1 + 0x28;
  }
  this->mSize = 0;
  return;
}

Assistant:

void clear() 
		{ 
			// Call destructor-in-place, not delete (we didn't
			// allocate this object with new).  Destroy everything.
			for (unsigned i = 0; i < mSize; i++)
			{
				mData[i].~T();
			}

			// Nothing is left
			mSize = 0; 
		}